

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O3

void duckdb::RadixScatterListVector
               (Vector *v,UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t prefix_len,
               idx_t width,idx_t offset)

{
  data_ptr_t *ppdVar1;
  VectorType VVar2;
  data_ptr_t pdVar3;
  sel_t *psVar4;
  data_ptr_t pdVar5;
  unsigned_long *puVar6;
  data_ptr_t pdVar7;
  long lVar8;
  VectorBuffer *pVVar9;
  Vector *pVVar10;
  idx_t count;
  size_t sVar11;
  SelectionVector *pSVar12;
  byte *pbVar13;
  byte *pbVar14;
  idx_t iVar15;
  ulong uVar16;
  idx_t iVar17;
  
  VVar2 = v->vector_type;
  pVVar10 = v;
  while (VVar2 == DICTIONARY_VECTOR) {
    DictionaryVector::VerifyDictionary(pVVar10);
    pVVar9 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pVVar10->auxiliary);
    pVVar10 = (Vector *)(pVVar9 + 1);
    VVar2 = *(VectorType *)&pVVar9[1]._vptr_VectorBuffer;
  }
  pdVar3 = pVVar10->data;
  pVVar10 = ListVector::GetEntry(v);
  count = ListVector::GetListSize(v);
  Vector::Flatten(pVVar10,count);
  if (has_null) {
    if (add_count != 0) {
      sVar11 = width - 2;
      iVar17 = 0;
      do {
        iVar15 = iVar17;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar15 = (idx_t)sel->sel_vector[iVar17];
        }
        psVar4 = vdata->sel->sel_vector;
        if (psVar4 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar4[iVar15];
        }
        uVar16 = iVar15 + offset;
        ppdVar1 = key_locations + iVar17;
        pdVar5 = *ppdVar1;
        puVar6 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar6 == (unsigned_long *)0x0) || ((puVar6[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0))
        {
          pbVar14 = pdVar5 + 1;
          *ppdVar1 = pbVar14;
          *pdVar5 = nulls_first;
          pdVar7 = *ppdVar1;
          lVar8 = *(long *)(pdVar3 + uVar16 * 0x10 + 8);
          *ppdVar1 = pdVar7 + 1;
          if (lVar8 == 0) {
            *pdVar7 = '\0';
            switchD_005681f0::default(*ppdVar1,0,sVar11);
            *ppdVar1 = *ppdVar1 + sVar11;
          }
          else {
            *pdVar7 = '\x01';
            pSVar12 = FlatVector::IncrementalSelectionVector();
            RowOperations::RadixScatter
                      (pVVar10,count,pSVar12,1,ppdVar1,false,true,false,prefix_len,sVar11,
                       *(idx_t *)(pdVar3 + uVar16 * 0x10));
          }
          if ((desc) && (*ppdVar1 = pbVar14, 1 < (long)width)) {
            do {
              *pbVar14 = ~*pbVar14;
              pbVar14 = *ppdVar1 + 1;
              *ppdVar1 = pbVar14;
            } while (pbVar14 < pdVar5 + width);
          }
        }
        else {
          *ppdVar1 = pdVar5 + 1;
          *pdVar5 = !nulls_first;
          switchD_005681f0::default(*ppdVar1,0,width - 1);
          *ppdVar1 = *ppdVar1 + (width - 1);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != add_count);
    }
  }
  else if (add_count != 0) {
    sVar11 = width - 1;
    iVar17 = 0;
    do {
      iVar15 = iVar17;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar15 = (idx_t)sel->sel_vector[iVar17];
      }
      psVar4 = vdata->sel->sel_vector;
      if (psVar4 != (sel_t *)0x0) {
        iVar15 = (idx_t)psVar4[iVar15];
      }
      ppdVar1 = key_locations + iVar17;
      pbVar14 = *ppdVar1;
      lVar8 = *(long *)(pdVar3 + iVar15 * 0x10 + offset * 0x10 + 8);
      *ppdVar1 = pbVar14 + 1;
      if (lVar8 == 0) {
        *pbVar14 = 0;
        switchD_005681f0::default(*ppdVar1,0,sVar11);
        *ppdVar1 = *ppdVar1 + sVar11;
      }
      else {
        *pbVar14 = 1;
        pSVar12 = FlatVector::IncrementalSelectionVector();
        RowOperations::RadixScatter
                  (pVVar10,count,pSVar12,1,ppdVar1,false,true,false,prefix_len,sVar11,
                   *(idx_t *)(pdVar3 + iVar15 * 0x10 + offset * 0x10));
      }
      if ((desc) && (*ppdVar1 = pbVar14, 0 < (long)width)) {
        pbVar13 = pbVar14 + width;
        do {
          *pbVar14 = ~*pbVar14;
          pbVar14 = *ppdVar1 + 1;
          *ppdVar1 = pbVar14;
        } while (pbVar14 < pbVar13);
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 != add_count);
  }
  return;
}

Assistant:

void RadixScatterListVector(Vector &v, UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                            data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                            const idx_t prefix_len, const idx_t width, const idx_t offset) {
	auto list_data = ListVector::GetData(v);
	auto &child_vector = ListVector::GetEntry(v);
	auto list_size = ListVector::GetListSize(v);
	child_vector.Flatten(list_size);

	// serialize null values
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				*key_location++ = valid;
				auto &list_entry = list_data[source_idx];
				if (list_entry.length > 0) {
					// denote that the list is not empty with a 1
					*key_location++ = 1;
					RowOperations::RadixScatter(child_vector, list_size, *FlatVector::IncrementalSelectionVector(), 1,
					                            key_locations + i, false, true, false, prefix_len, width - 2,
					                            list_entry.offset);
				} else {
					// denote that the list is empty with a 0
					*key_location++ = 0;
					// mark rest of bits as empty
					memset(key_location, '\0', width - 2);
					key_location += width - 2;
				}
				// invert bits if desc
				if (desc) {
					// skip over validity byte, handled by nulls first/last
					for (key_location = key_location_start + 1; key_location < key_location_start + width;
					     key_location++) {
						*key_location = ~*key_location;
					}
				}
			} else {
				*key_location++ = invalid;
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			auto &list_entry = list_data[source_idx];
			data_ptr_t &key_location = key_locations[i];
			const data_ptr_t key_location_start = key_location;
			if (list_entry.length > 0) {
				// denote that the list is not empty with a 1
				*key_location++ = 1;
				RowOperations::RadixScatter(child_vector, list_size, *FlatVector::IncrementalSelectionVector(), 1,
				                            key_locations + i, false, true, false, prefix_len, width - 1,
				                            list_entry.offset);
			} else {
				// denote that the list is empty with a 0
				*key_location++ = 0;
				// mark rest of bits as empty
				memset(key_location, '\0', width - 1);
				key_location += width - 1;
			}
			// invert bits if desc
			if (desc) {
				for (key_location = key_location_start; key_location < key_location_start + width; key_location++) {
					*key_location = ~*key_location;
				}
			}
			D_ASSERT(key_location == key_location_start + width);
		}
	}
}